

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O1

idx_t __thiscall duckdb::Blob::GetBlobSize(Blob *this,string_t str)

{
  idx_t iVar1;
  string_t str_00;
  CastParameters parameters;
  CastParameters local_30;
  
  str_00.value._8_8_ = str.value._0_8_;
  local_30.cast_data.ptr = (BoundCastData *)0x0;
  local_30.strict = false;
  local_30.error_message = (string *)0x0;
  local_30.local_state.ptr = (FunctionLocalState *)0x0;
  local_30.query_location.index = 0xffffffffffffffff;
  local_30.nullify_parent = false;
  str_00.value._0_8_ = this;
  iVar1 = GetBlobSize(str_00,&local_30);
  return iVar1;
}

Assistant:

idx_t Blob::GetBlobSize(string_t str) {
	CastParameters parameters;
	return GetBlobSize(str, parameters);
}